

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

RayTracingPipelineDesc * __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GetRayTracingPipelineDesc
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this)

{
  bool bVar1;
  Char *pCVar2;
  char (*in_RCX) [37];
  undefined1 local_60 [8];
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  PipelineStateBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = this;
  CheckPipelineReady(this);
  bVar1 = PipelineStateDesc::IsRayTracingPipeline
                    (&(this->
                      super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                      ).m_Desc);
  if (!bVar1) {
    FormatString<char[26],char[36]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"this->m_Desc.IsRayTracingPipeline()",(char (*) [36])in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [37])0x214;
    DebugAssertionFailed
              (pCVar2,"GetRayTracingPipelineDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x214);
    std::__cxx11::string::~string((string *)local_30);
  }
  if ((this->field_6).m_pGraphicsPipelineData == (GraphicsPipelineData *)0x0) {
    FormatString<char[26],char[37]>
              ((string *)local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pRayTracingPipelineData != nullptr",in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetRayTracingPipelineDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x215);
    std::__cxx11::string::~string((string *)local_60);
  }
  return (RayTracingPipelineDesc *)(this->field_6).m_pGraphicsPipelineData;
}

Assistant:

GetRayTracingPipelineDesc() const override final
    {
        CheckPipelineReady();
        VERIFY_EXPR(this->m_Desc.IsRayTracingPipeline());
        VERIFY_EXPR(m_pRayTracingPipelineData != nullptr);
        return m_pRayTracingPipelineData->Desc;
    }